

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf.c
# Opt level: O0

void throughput_server(char *addr,size_t msgsize,int count)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  float fVar6;
  float local_58;
  float local_50;
  float total;
  float mbps;
  float msgpersec;
  uint64_t end;
  uint64_t start;
  int i;
  int rv;
  nng_msg *msg;
  nng_socket s;
  int count_local;
  size_t msgsize_local;
  char *addr_local;
  
  msg._4_4_ = count;
  _s = msgsize;
  iVar1 = nng_pair1_open(&msg);
  if (iVar1 != 0) {
    uVar2 = nng_strerror(iVar1);
    die("nng_socket: %s",uVar2);
  }
  iVar1 = nng_socket_set_int(msg._0_4_,"recv-buffer",0x80);
  if (iVar1 != 0) {
    uVar2 = nng_strerror(iVar1);
    die("nng_socket_set(nng_opt_recvbuf): %s",uVar2);
  }
  iVar1 = nng_listen(msg._0_4_,addr,0,0);
  if (iVar1 != 0) {
    uVar2 = nng_strerror(iVar1);
    die("nng_listen: %s",uVar2);
  }
  iVar1 = nng_recvmsg(msg._0_4_,&i,0);
  if (iVar1 != 0) {
    uVar2 = nng_strerror(iVar1);
    die("nng_recvmsg: %s",uVar2);
  }
  nng_msg_free(_i);
  lVar3 = nng_clock();
  for (start._0_4_ = 0; (int)start < (int)msg._4_4_; start._0_4_ = (int)start + 1) {
    iVar1 = nng_recvmsg(msg._0_4_,&i,0);
    if (iVar1 != 0) {
      uVar2 = nng_strerror(iVar1);
      die("nng_recvmsg: %s",uVar2);
    }
    sVar4 = nng_msg_len(_i);
    if (sVar4 != _s) {
      uVar2 = nng_msg_len(_i);
      die("wrong message size: %lu != %lu",uVar2,_s);
    }
    nng_msg_free(_i);
  }
  lVar5 = nng_clock();
  nng_send(msg._0_4_,"",0);
  nng_msleep(200);
  nng_socket_close(msg._0_4_);
  local_50 = (float)(ulong)(lVar5 - lVar3);
  fVar6 = (float)(int)msg._4_4_ / (local_50 / 1000.0);
  local_58 = (float)_s;
  printf("total time: %.3f [s]\n",(double)(local_50 / 1000.0));
  printf("message size: %d [B]\n",_s & 0xffffffff);
  printf("message count: %d\n",(ulong)msg._4_4_);
  printf("throughput: %.f [msg/s]\n",(double)fVar6);
  printf("throughput: %.3f [Mb/s]\n",(double)((fVar6 * 8.0 * local_58) / 1048576.0));
  return;
}

Assistant:

void
throughput_server(const char *addr, size_t msgsize, int count)
{
	nng_socket s;
	nng_msg   *msg;
	int        rv;
	int        i;
	uint64_t   start, end;
	float      msgpersec, mbps, total;

	if ((rv = nng_pair1_open(&s)) != 0) {
		die("nng_socket: %s", nng_strerror(rv));
	}
	rv = nng_socket_set_int(s, NNG_OPT_RECVBUF, 128);
	if (rv != 0) {
		die("nng_socket_set(nng_opt_recvbuf): %s", nng_strerror(rv));
	}

	// XXX: set no delay
	// XXX: other options (TLS in the future?, Linger?)

	if ((rv = nng_listen(s, addr, NULL, 0)) != 0) {
		die("nng_listen: %s", nng_strerror(rv));
	}

	// Receive first synchronization message.
	if ((rv = nng_recvmsg(s, &msg, 0)) != 0) {
		die("nng_recvmsg: %s", nng_strerror(rv));
	}
	nng_msg_free(msg);
	start = nng_clock();

	for (i = 0; i < count; i++) {
		if ((rv = nng_recvmsg(s, &msg, 0)) != 0) {
			die("nng_recvmsg: %s", nng_strerror(rv));
		}
		if (nng_msg_len(msg) != msgsize) {
			die("wrong message size: %lu != %lu", nng_msg_len(msg),
			    msgsize);
		}
		nng_msg_free(msg);
	}
	end = nng_clock();
	// Send a synchronization message (empty) to the other side,
	// and wait a bit to make sure it goes out the wire.
	nng_send(s, "", 0, 0);
	nng_msleep(200);
	nng_socket_close(s);
	total     = (float) ((end - start)) / 1000;
	msgpersec = (float) (count) / total;
	mbps      = (float) (msgpersec * 8 * msgsize) / (1024 * 1024);
	printf("total time: %.3f [s]\n", total);
	printf("message size: %d [B]\n", (int) msgsize);
	printf("message count: %d\n", count);
	printf("throughput: %.f [msg/s]\n", msgpersec);
	printf("throughput: %.3f [Mb/s]\n", mbps);
}